

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhMoveLocalCell(lhcell *pCell,sxu16 iOfft,void *pData,unqlite_int64 nData)

{
  sxu16 sVar1;
  lhpage *plVar2;
  lhcell *plVar3;
  lhcell *pSibeling;
  lhpage *pPage;
  sxu16 iKeyOfft;
  unqlite_int64 nData_local;
  void *pData_local;
  sxu16 iOfft_local;
  lhcell *pCell_local;
  
  sVar1 = pCell->iStart;
  plVar2 = pCell->pPage;
  plVar3 = lhFindSibeling(pCell);
  if (plVar3 == (lhcell *)0x0) {
    SyBigEndianPack16(plVar2->pRaw->zData,pCell->iNext);
    (plVar2->sHdr).iOfft = pCell->iNext;
  }
  else {
    SyBigEndianPack16(plVar2->pRaw->zData + (int)(plVar3->iStart + 0x10),pCell->iNext);
    plVar3->iNext = pCell->iNext;
  }
  pCell->iStart = iOfft;
  pCell->nData = nData;
  lhCellWriteLocalPayload
            (pCell,plVar2->pRaw->zData + (ushort)(sVar1 + 0x1a),pCell->nKey,pData,nData);
  lhCellWriteHeader(pCell);
  return 0;
}

Assistant:

static int lhMoveLocalCell(
	lhcell *pCell,
	sxu16 iOfft,
	const void *pData,
	unqlite_int64 nData
	)
{
	sxu16 iKeyOfft = pCell->iStart + L_HASH_CELL_SZ;
	lhpage *pPage = pCell->pPage;
	lhcell *pSibeling;
	pSibeling = lhFindSibeling(pCell);
	if( pSibeling ){
		/* Fix link */
		SyBigEndianPack16(&pPage->pRaw->zData[pSibeling->iStart + 4/*Hash*/+4/*Key*/+8/*Data*/],pCell->iNext);
		pSibeling->iNext = pCell->iNext;
	}else{
		/* First cell, update page header only */
		SyBigEndianPack16(pPage->pRaw->zData,pCell->iNext);
		pPage->sHdr.iOfft = pCell->iNext;
	}
	/* Set the new offset */
	pCell->iStart = iOfft;
	pCell->nData = (sxu64)nData;
	/* Write the cell payload */
	lhCellWriteLocalPayload(pCell,(const void *)&pPage->pRaw->zData[iKeyOfft],pCell->nKey,pData,nData);
	/* Finally write the cell header */
	lhCellWriteHeader(pCell);
	/* All done */
	return UNQLITE_OK;
}